

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

_Bool arm_is_secure(CPUARMState_conflict *env)

{
  _Bool _Var1;
  
  if ((env->features & 0x200000000) == 0) {
    _Var1 = false;
  }
  else if (env->aarch64 == 0) {
    _Var1 = true;
    if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_005d9117;
  }
  else {
    _Var1 = true;
    if ((~env->pstate & 0xc) != 0) {
LAB_005d9117:
      return ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  return _Var1;
}

Assistant:

static inline bool arm_is_el3_or_mon(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        if (is_a64(env) && extract32(env->pstate, 2, 2) == 3) {
            /* CPU currently in AArch64 state and EL3 */
            return true;
        } else if (!is_a64(env) &&
                (env->uncached_cpsr & CPSR_M) == ARM_CPU_MODE_MON) {
            /* CPU currently in AArch32 state and monitor mode */
            return true;
        }
    }
    return false;
}